

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O0

longlong tid_to_ll(id *tid)

{
  char *__nptr;
  longlong lVar1;
  string local_30;
  id *local_10;
  id *tid_local;
  
  local_10 = tid;
  tid_to_string_abi_cxx11_(&local_30,tid);
  __nptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_30);
  lVar1 = atoll(__nptr);
  std::__cxx11::string::~string((string *)&local_30);
  return lVar1;
}

Assistant:

long long tid_to_ll(const thread::id& tid)
{
    return atoll(tid_to_string(tid).c_str());
}